

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_io.c
# Opt level: O1

void * voutlet_new(t_symbol *s)

{
  t_object *owner;
  _glist *x;
  _outlet *p_Var1;
  
  owner = (t_object *)pd_new(voutlet_class);
  x = canvas_getcurrent();
  owner[1].te_g.g_pd = (t_pd)x;
  p_Var1 = canvas_addoutlet(x,(t_pd *)owner,(t_symbol *)0x0);
  owner[1].te_g.g_next = (_gobj *)p_Var1;
  inlet_new(owner,(t_pd *)owner,(t_symbol *)0x0,(t_symbol *)0x0);
  *(undefined4 *)&owner[1].te_binbuf = 0;
  owner[1].te_outlet = (_outlet *)0x0;
  return owner;
}

Assistant:

static void *voutlet_new(t_symbol *s)
{
    t_voutlet *x = (t_voutlet *)pd_new(voutlet_class);
    x->x_canvas = canvas_getcurrent();
    x->x_parentoutlet = canvas_addoutlet(x->x_canvas, &x->x_obj.ob_pd, 0);
    inlet_new(&x->x_obj, &x->x_obj.ob_pd, 0, 0);
    x->x_bufsize = 0;
    x->x_buf = 0;
    return (x);
}